

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O1

bool __thiscall Assimp::STLImporter::LoadBinaryFile(STLImporter *this)

{
  size_t __n;
  ushort uVar1;
  aiNode *paVar2;
  undefined8 uVar3;
  aiScene *paVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  STLImporter *pSVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  aiMesh **ppaVar15;
  aiMesh *pMesh;
  aiColor4D **ppaVar16;
  long lVar17;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiColor4D *paVar18;
  aiNode *this_00;
  aiNode **ppaVar19;
  uint *puVar20;
  Logger *pLVar21;
  runtime_error *prVar22;
  uint uVar23;
  ulong uVar24;
  char *pcVar25;
  float fVar26;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  STLImporter *local_48;
  aiColor4D *local_40;
  size_t local_38;
  
  this->pScene->mNumMeshes = 1;
  ppaVar15 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar15;
  pMesh = (aiMesh *)operator_new(0x520);
  pMesh->mPrimitiveTypes = 0;
  pMesh->mNumVertices = 0;
  pMesh->mNumFaces = 0;
  memset(&pMesh->mVertices,0,0xcc);
  pMesh->mBones = (aiBone **)0x0;
  pMesh->mMaterialIndex = 0;
  (pMesh->mName).length = 0;
  (pMesh->mName).data[0] = '\0';
  memset((pMesh->mName).data + 1,0x1b,0x3ff);
  pMesh->mNumAnimMeshes = 0;
  pMesh->mAnimMeshes = (aiAnimMesh **)0x0;
  pMesh->mMethod = 0;
  (pMesh->mAABB).mMin.x = 0.0;
  (pMesh->mAABB).mMin.y = 0.0;
  (pMesh->mAABB).mMin.z = 0.0;
  (pMesh->mAABB).mMax.x = 0.0;
  (pMesh->mAABB).mMax.y = 0.0;
  (pMesh->mAABB).mMax.z = 0.0;
  pMesh->mTextureCoords[0] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[1] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[2] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[3] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[4] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[5] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[6] = (aiVector3D *)0x0;
  pMesh->mTextureCoords[7] = (aiVector3D *)0x0;
  pMesh->mNumUVComponents[0] = 0;
  pMesh->mNumUVComponents[1] = 0;
  pMesh->mNumUVComponents[2] = 0;
  pMesh->mNumUVComponents[3] = 0;
  pMesh->mNumUVComponents[4] = 0;
  pMesh->mNumUVComponents[5] = 0;
  pMesh->mNumUVComponents[6] = 0;
  pMesh->mNumUVComponents[7] = 0;
  pMesh->mColors[0] = (aiColor4D *)0x0;
  pMesh->mColors[1] = (aiColor4D *)0x0;
  pMesh->mColors[2] = (aiColor4D *)0x0;
  pMesh->mColors[3] = (aiColor4D *)0x0;
  pMesh->mColors[4] = (aiColor4D *)0x0;
  pMesh->mColors[5] = (aiColor4D *)0x0;
  pMesh->mColors[6] = (aiColor4D *)0x0;
  pMesh->mColors[7] = (aiColor4D *)0x0;
  *this->pScene->mMeshes = pMesh;
  pMesh->mMaterialIndex = 0;
  if (this->fileSize < 0x54) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"STL: file is too small for the header","");
    std::runtime_error::runtime_error(prVar22,(string *)local_68);
    *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppaVar16 = pMesh->mColors;
  pcVar25 = this->mBuffer;
  bVar13 = true;
  lVar17 = 0;
  do {
    if (pcVar25[lVar17] == 'C') {
      if (pcVar25[lVar17 + 1] == 'O') {
        if (pcVar25[lVar17 + 2] == 'L') {
          if (pcVar25[lVar17 + 3] == 'O') {
            if (pcVar25[lVar17 + 4] == 'R') {
              lVar12 = lVar17 + 6;
              if (pcVar25[lVar17 + 5] == '=') {
                pLVar21 = DefaultLogger::get();
                Logger::info(pLVar21,"STL: Taking code path for Materialise files");
                (this->clrColorDefault).r = (float)(byte)pcVar25[lVar17 + 6] * 0.003921569;
                (this->clrColorDefault).g = (float)(byte)pcVar25[lVar17 + 7] * 0.003921569;
                (this->clrColorDefault).b = (float)(byte)pcVar25[lVar17 + 8] * 0.003921569;
                (this->clrColorDefault).a = (float)(byte)pcVar25[lVar17 + 9] * 0.003921569;
                break;
              }
            }
            else {
              lVar12 = lVar17 + 5;
            }
          }
          else {
            lVar12 = lVar17 + 4;
          }
        }
        else {
          lVar12 = lVar17 + 3;
        }
      }
      else {
        lVar12 = lVar17 + 2;
      }
    }
    else {
      lVar12 = lVar17 + 1;
    }
    lVar17 = lVar12;
    bVar13 = lVar17 < 0x50;
  } while (lVar17 < 0x50);
  pcVar25 = this->mBuffer;
  paVar2 = this->pScene->mRootNode;
  (paVar2->mName).length = 0xc;
  builtin_strncpy((paVar2->mName).data,"<STL_BINARY>",0xd);
  uVar23 = *(uint *)(pcVar25 + 0x50);
  pMesh->mNumFaces = uVar23;
  if (this->fileSize < uVar23 * 0x32 + 0x54) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"STL: file is too small to hold all facets","");
    std::runtime_error::runtime_error(prVar22,(string *)local_68);
    *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_48 = this;
  if (uVar23 == 0) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"STL: file is empty. There are no facets defined","");
    std::runtime_error::runtime_error(prVar22,(string *)local_68);
    *(undefined ***)prVar22 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar22,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar23 = uVar23 * 3;
  pMesh->mNumVertices = uVar23;
  uVar24 = (ulong)uVar23 * 0xc;
  __s = (aiVector3D *)operator_new__(uVar24);
  __n = (((ulong)uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc;
  memset(__s,0,__n);
  pMesh->mVertices = __s;
  __s_00 = (aiVector3D *)operator_new__(uVar24);
  memset(__s_00,0,__n);
  pMesh->mNormals = __s_00;
  if (pMesh->mNumFaces != 0) {
    pcVar25 = pcVar25 + 0x54;
    local_40 = &local_48->clrColorDefault;
    uVar24 = 0;
    do {
      uVar3 = *(undefined8 *)pcVar25;
      fVar26 = *(float *)(pcVar25 + 8);
      __s_00->x = (float)(int)uVar3;
      __s_00->y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00->z = fVar26;
      __s_00[1].x = (float)(int)uVar3;
      __s_00[1].y = (float)(int)((ulong)uVar3 >> 0x20);
      fVar26 = __s_00->z;
      __s_00[1].z = fVar26;
      __s_00[2].x = (float)(int)uVar3;
      __s_00[2].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00[2].z = fVar26;
      uVar3 = *(undefined8 *)(pcVar25 + 0xc);
      fVar26 = *(float *)(pcVar25 + 0x14);
      __s->x = (float)(int)uVar3;
      __s->y = (float)(int)((ulong)uVar3 >> 0x20);
      __s->z = fVar26;
      uVar3 = *(undefined8 *)(pcVar25 + 0x18);
      fVar26 = *(float *)(pcVar25 + 0x20);
      __s[1].x = (float)(int)uVar3;
      __s[1].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s[1].z = fVar26;
      uVar3 = *(undefined8 *)(pcVar25 + 0x24);
      fVar26 = *(float *)(pcVar25 + 0x2c);
      __s[2].x = (float)(int)uVar3;
      __s[2].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s[2].z = fVar26;
      uVar1 = *(ushort *)(pcVar25 + 0x30);
      if ((short)uVar1 < 0) {
        if (*ppaVar16 == (aiColor4D *)0x0) {
          uVar23 = pMesh->mNumVertices;
          local_38 = (ulong)uVar23 << 4;
          paVar18 = (aiColor4D *)operator_new__(local_38);
          if ((ulong)uVar23 != 0) {
            memset(paVar18,0,local_38);
          }
          pMesh->mColors[0] = paVar18;
          uVar23 = pMesh->mNumVertices;
          if (uVar23 != 0) {
            uVar14 = 0;
            do {
              paVar18 = pMesh->mColors[0];
              pMesh->mColors[0] = paVar18 + 1;
              fVar26 = local_40->g;
              fVar9 = local_40->b;
              fVar10 = local_40->a;
              paVar18->r = local_40->r;
              paVar18->g = fVar26;
              paVar18->b = fVar9;
              paVar18->a = fVar10;
              uVar14 = uVar14 + 1;
              uVar23 = pMesh->mNumVertices;
            } while (uVar14 < uVar23);
          }
          *ppaVar16 = *ppaVar16 + -(ulong)uVar23;
          pLVar21 = DefaultLogger::get();
          Logger::info(pLVar21,"STL: Mesh has vertex colors");
        }
        uVar23 = (int)uVar24 * 3;
        paVar18 = *ppaVar16 + uVar23;
        (*ppaVar16)[uVar23].a = 1.0;
        fVar26 = (float)(uVar1 & 0x31) * 0.032258064;
        if (bVar13) {
          paVar18->r = fVar26;
          paVar18->g = (float)(uVar1 >> 5 & 0x31) * 0.032258064;
          paVar18->b = (float)(uVar1 >> 10 & 0xfff1) * 0.032258064;
        }
        else {
          paVar18->b = fVar26;
          paVar18->g = (float)(uVar1 >> 5 & 0x31) * 0.032258064;
          paVar18->r = (float)(uVar1 >> 10 & 0xfff1) * 0.032258064;
        }
        uVar5 = paVar18->r;
        uVar6 = paVar18->g;
        uVar7 = paVar18->b;
        uVar8 = paVar18->a;
        paVar18[1].r = (float)uVar5;
        paVar18[1].g = (float)uVar6;
        paVar18[1].b = (float)uVar7;
        paVar18[1].a = (float)uVar8;
        paVar18[2].r = (float)uVar5;
        paVar18[2].g = (float)uVar6;
        paVar18[2].b = (float)uVar7;
        paVar18[2].a = (float)uVar8;
      }
      __s_00 = __s_00 + 3;
      __s = __s + 3;
      pcVar25 = pcVar25 + 0x32;
      uVar24 = uVar24 + 1;
    } while (uVar24 < pMesh->mNumFaces);
  }
  addFacesToMesh(pMesh);
  pSVar11 = local_48;
  paVar2 = local_48->pScene->mRootNode;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  this_00->mParent = paVar2;
  paVar2->mNumChildren = 1;
  ppaVar19 = (aiNode **)operator_new__(8);
  paVar2->mChildren = ppaVar19;
  *ppaVar19 = this_00;
  paVar4 = pSVar11->pScene;
  this_00->mNumMeshes = paVar4->mNumMeshes;
  puVar20 = (uint *)operator_new__((ulong)paVar4->mNumMeshes << 2);
  this_00->mMeshes = puVar20;
  if (pSVar11->pScene->mNumMeshes != 0) {
    uVar24 = 0;
    do {
      this_00->mMeshes[uVar24] = (uint)uVar24;
      uVar24 = uVar24 + 1;
    } while (uVar24 < pSVar11->pScene->mNumMeshes);
  }
  if ((bVar13) && (*ppaVar16 == (aiColor4D *)0x0)) {
    bVar13 = true;
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool STLImporter::LoadBinaryFile()
{
    // allocate one mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pMesh = pScene->mMeshes[0] = new aiMesh();
    pMesh->mMaterialIndex = 0;

    // skip the first 80 bytes
    if (fileSize < 84) {
        throw DeadlyImportError("STL: file is too small for the header");
    }
    bool bIsMaterialise = false;

    // search for an occurrence of "COLOR=" in the header
    const unsigned char* sz2 = (const unsigned char*)mBuffer;
    const unsigned char* const szEnd = sz2+80;
    while (sz2 < szEnd) {

        if ('C' == *sz2++ && 'O' == *sz2++ && 'L' == *sz2++ &&
            'O' == *sz2++ && 'R' == *sz2++ && '=' == *sz2++)    {

            // read the default vertex color for facets
            bIsMaterialise = true;
            ASSIMP_LOG_INFO("STL: Taking code path for Materialise files");
            const ai_real invByte = (ai_real)1.0 / ( ai_real )255.0;
            clrColorDefault.r = (*sz2++) * invByte;
            clrColorDefault.g = (*sz2++) * invByte;
            clrColorDefault.b = (*sz2++) * invByte;
            clrColorDefault.a = (*sz2++) * invByte;
            break;
        }
    }
    const unsigned char* sz = (const unsigned char*)mBuffer + 80;

    // now read the number of facets
    pScene->mRootNode->mName.Set("<STL_BINARY>");

    pMesh->mNumFaces = *((uint32_t*)sz);
    sz += 4;

    if (fileSize < 84 + pMesh->mNumFaces*50) {
        throw DeadlyImportError("STL: file is too small to hold all facets");
    }

    if (!pMesh->mNumFaces) {
        throw DeadlyImportError("STL: file is empty. There are no facets defined");
    }

    pMesh->mNumVertices = pMesh->mNumFaces*3;

    
    aiVector3D *vp = pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
    aiVector3D *vn = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    typedef aiVector3t<float> aiVector3F;
    aiVector3F* theVec;
    aiVector3F theVec3F;
    
    for ( unsigned int i = 0; i < pMesh->mNumFaces; ++i ) {
        // NOTE: Blender sometimes writes empty normals ... this is not
        // our fault ... the RemoveInvalidData helper step should fix that

        // There's one normal for the face in the STL; use it three times
        // for vertex normals
        theVec = (aiVector3F*) sz;
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vn->x = theVec3F.x; vn->y = theVec3F.y; vn->z = theVec3F.z;
        *(vn+1) = *vn;
        *(vn+2) = *vn;
        ++theVec;
        vn += 3;

        // vertex 1
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 2
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 3
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;
        
        sz = (const unsigned char*) theVec;

        uint16_t color = *((uint16_t*)sz);
        sz += 2;

        if (color & (1 << 15))
        {
            // seems we need to take the color
            if (!pMesh->mColors[0])
            {
                pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
                for (unsigned int i = 0; i <pMesh->mNumVertices;++i)
                    *pMesh->mColors[0]++ = this->clrColorDefault;
                pMesh->mColors[0] -= pMesh->mNumVertices;

                ASSIMP_LOG_INFO("STL: Mesh has vertex colors");
            }
            aiColor4D* clr = &pMesh->mColors[0][i*3];
            clr->a = 1.0;
            const ai_real invVal( (ai_real)1.0 / ( ai_real )31.0 );
            if (bIsMaterialise) // this is reversed
            {
                clr->r = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->b = ((color & (0x31u<<10))>>10u) *invVal;
            }
            else
            {
                clr->b = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->r = ((color & (0x31u<<10))>>10u) *invVal;
            }
            // assign the color to all vertices of the face
            *(clr+1) = *clr;
            *(clr+2) = *clr;
        }
    }

    // now copy faces
    addFacesToMesh(pMesh);

    aiNode* root = pScene->mRootNode;

    // allocate one node
    aiNode* node = new aiNode();
    node->mParent = root;

    root->mNumChildren = 1u;
    root->mChildren = new aiNode*[root->mNumChildren];
    root->mChildren[0] = node;

    // add all created meshes to the single node
    node->mNumMeshes = pScene->mNumMeshes;
    node->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; i++)
        node->mMeshes[i] = i;

    if (bIsMaterialise && !pMesh->mColors[0])
    {
        // use the color as diffuse material color
        return true;
    }
    return false;
}